

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O0

Trampoline * __thiscall
LambdaMeaning::Eval(Trampoline *__return_storage_ptr__,LambdaMeaning *this,Sexp *act)

{
  bool expr;
  Sexp *value;
  FrameProtector local_38;
  FrameProtector __frame_prot;
  ContractFrameProtector local_20;
  ContractFrameProtector __contract_frame;
  Sexp *act_local;
  LambdaMeaning *this_local;
  
  __contract_frame.protected_frame = (ContractFrame *)act;
  ContractFrameProtector::ContractFrameProtector(&local_20,"Eval");
  expr = Sexp::IsActivation((Sexp *)__contract_frame.protected_frame);
  ContractFrameProtector::CheckPrecondition(&local_20,expr,"act->IsActivation()");
  FrameProtector::FrameProtector(&local_38,"Eval");
  FrameProtector::ProtectValue(&local_38,(Sexp **)&__contract_frame,"act");
  value = GcHeap::AllocateFunction(this,(Sexp *)__contract_frame.protected_frame);
  Trampoline::Trampoline(__return_storage_ptr__,value);
  FrameProtector::~FrameProtector(&local_38);
  ContractFrameProtector::~ContractFrameProtector(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Trampoline LambdaMeaning::Eval(Sexp *act) {
  CONTRACT { PRECONDITION(act->IsActivation()); }